

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O2

void __thiscall duckdb::RegexpBaseBindData::RegexpBaseBindData(RegexpBaseBindData *this)

{
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)&PTR__RegexpBaseBindData_027a9bd0;
  duckdb_re2::RE2::Options::Options(&this->options);
  (this->constant_string)._M_dataplus._M_p = (pointer)&(this->constant_string).field_2;
  (this->constant_string)._M_string_length = 0;
  (this->constant_string).field_2._M_local_buf[0] = '\0';
  this->constant_pattern = false;
  return;
}

Assistant:

RegexpBaseBindData::RegexpBaseBindData() : constant_pattern(false) {
}